

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

FFSTypeHandle_conflict FFSset_fixed_target(FFSContext c,FMStructDescList struct_list)

{
  int iVar1;
  FFSTypeHandle_conflict *pp_Var2;
  FMFormat_conflict p_Var3;
  FFSTypeHandle_conflict p_Var4;
  long lVar5;
  
  p_Var3 = register_data_format(c->fmc,struct_list);
  p_Var4 = FFSTypeHandle_by_index(c,p_Var3->format_index);
  p_Var4->is_fixed_target = 1;
  iVar1 = c->handle_list_size;
  if (0 < (long)iVar1) {
    pp_Var2 = c->handle_list;
    lVar5 = 0;
    do {
      if (pp_Var2[lVar5] != (FFSTypeHandle_conflict)0x0) {
        pp_Var2[lVar5]->status = not_checked;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return p_Var4;
}

Assistant:

extern FFSTypeHandle
FFSset_fixed_target(FFSContext c, FMStructDescList struct_list)
{
    FMFormat fmf = register_data_format(c->fmc, struct_list);
    int index;
    FFSTypeHandle handle;
    index = fmf->format_index;
    handle = FFSTypeHandle_by_index(c, index);
    handle->is_fixed_target = 1;
    /* any new target may invalidate prior conversion decisions */
    reset_prior_conversions(c);
    return handle;
}